

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdServer.hpp
# Opt level: O2

void __thiscall Statsd::StatsdServer::StatsdServer(StatsdServer *this,unsigned_short port)

{
  int iVar1;
  int *piVar2;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  sockaddr local_28;
  
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  (this->m_errorMessage)._M_string_length = 0;
  (this->m_errorMessage).field_2._M_local_buf[0] = '\0';
  iVar1 = socket(2,2,0x11);
  this->m_socket = iVar1;
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    std::__cxx11::to_string(&sStack_68,*piVar2);
    std::operator+(&local_48,"socket creation failed: errno=",&sStack_68);
  }
  else {
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    local_28.sa_family = 2;
    local_28.sa_data._0_2_ = port << 8 | port >> 8;
    local_28.sa_data[2] = '\0';
    local_28.sa_data[3] = '\0';
    local_28.sa_data[4] = '\0';
    local_28.sa_data[5] = '\0';
    iVar1 = bind(iVar1,&local_28,0x10);
    if (iVar1 == 0) {
      return;
    }
    close(this->m_socket);
    this->m_socket = -1;
    piVar2 = __errno_location();
    std::__cxx11::to_string(&sStack_68,*piVar2);
    std::operator+(&local_48,"bind failed: errno=",&sStack_68);
  }
  std::__cxx11::string::operator=((string *)&this->m_errorMessage,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  return;
}

Assistant:

StatsdServer(unsigned short port = 8125) noexcept {
#ifdef _WIN32
        if (!detail::WinSockSingleton::getInstance().ok()) {
            m_errorMessage = "WSAStartup failed: errno=" + std::to_string(SOCKET_ERRNO);
        }
#endif

        // Create the socket
        m_socket = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
        if (!detail::isValidSocket(m_socket)) {
            m_errorMessage = "socket creation failed: errno=" + std::to_string(SOCKET_ERRNO);
            return;
        }

        // Binding should be with ipv4 to all interfaces
        struct sockaddr_in address {};
        address.sin_family = AF_INET;
        address.sin_port = htons(port);
        address.sin_addr.s_addr = INADDR_ANY;

        // Try to bind
        if (bind(m_socket, reinterpret_cast<const struct sockaddr*>(&address), sizeof(address)) != 0) {
            SOCKET_CLOSE(m_socket);
            m_socket = k_invalidSocket;
            m_errorMessage = "bind failed: errno=" + std::to_string(SOCKET_ERRNO);
        }
    }